

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::Array<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>::
reserve(Array<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
        *this,size_t count)

{
  int32_t *piVar1;
  Hdr *pHVar2;
  FreeFunc *pFVar3;
  BufHdr *pBVar4;
  size_t sVar5;
  EVP_PKEY_CTX *dst;
  Hdr *pHVar6;
  bool bVar7;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  pHVar6 = (this->
           super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
           ).m_hdr;
  if (((pHVar6 == (Hdr *)0x0) || ((pHVar6->super_RefCount).m_refCount != 1)) ||
     (bVar7 = true, pHVar6->m_bufferSize < count << 3)) {
    sVar5 = getAllocSize<4096ul>(count << 3);
    dst = (EVP_PKEY_CTX *)operator_new(sVar5 + 0x28,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(undefined ***)dst = &PTR__RefCount_0019ca28;
    *(size_t *)(dst + 0x18) = sVar5;
    *(undefined8 *)(dst + 0x20) = 0;
    *(code **)(dst + 8) = mem::deallocate;
    local_38.m_p = (Hdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
    bVar7 = local_38.m_p != (Hdr *)0x0;
    if (bVar7) {
      pHVar6 = local_38.m_p + 1;
      sVar5 = (this->
              super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
              ).m_count;
      if (sVar5 != 0) {
        __wrap_memcpy(pHVar6,(this->
                             super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
                             ).m_p,sVar5 << 3);
      }
      pHVar2 = (this->
               super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
               ).m_hdr;
      if (pHVar2 != (Hdr *)0x0) {
        LOCK();
        piVar1 = &(pHVar2->super_RefCount).m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar2->super_RefCount)._vptr_RefCount)(pHVar2);
          LOCK();
          piVar1 = &(pHVar2->super_RefCount).m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar3 = (pHVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
            (*pFVar3)(pHVar2);
          }
        }
      }
      pBVar4 = local_38.m_p;
      (this->
      super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
      ).m_p = (BoxListEntry<int> **)pHVar6;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->
      super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
      ).m_hdr = pBVar4;
    }
    rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
  }
  return bVar7;
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}